

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

void bench_keygen_run(void *arg,int iters)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  size_t len;
  uchar pub33 [33];
  secp256k1_pubkey pubkey;
  undefined8 local_a0;
  undefined1 local_98;
  undefined8 local_97;
  undefined8 uStack_8f;
  undefined8 local_87;
  undefined8 uStack_7f;
  undefined1 local_70 [64];
  
  if (0 < iters) {
    do {
      local_a0 = 0x21;
      lVar4 = *arg;
      iVar2 = secp256k1_ec_pubkey_create(lVar4,local_70,(undefined8 *)((long)arg + 0x28));
      if (iVar2 == 0) {
        bench_keygen_run_cold_2();
LAB_00103f6e:
        bench_keygen_run_cold_1();
        cVar5 = '\0';
        cVar6 = '\x01';
        cVar7 = '\x02';
        cVar8 = '\x03';
        cVar9 = '\x04';
        cVar10 = '\x05';
        cVar11 = '\x06';
        cVar12 = '\a';
        cVar13 = '\b';
        cVar14 = '\t';
        cVar15 = '\n';
        cVar16 = '\v';
        cVar17 = '\f';
        cVar18 = '\r';
        cVar19 = '\x0e';
        cVar20 = '\x0f';
        lVar3 = 0;
        do {
          pcVar1 = (char *)(lVar4 + 0x28 + lVar3);
          *pcVar1 = cVar5 + 'A';
          pcVar1[1] = cVar6 + 'A';
          pcVar1[2] = cVar7 + 'A';
          pcVar1[3] = cVar8 + 'A';
          pcVar1[4] = cVar9 + 'A';
          pcVar1[5] = cVar10 + 'A';
          pcVar1[6] = cVar11 + 'A';
          pcVar1[7] = cVar12 + 'A';
          pcVar1[8] = cVar13 + 'A';
          pcVar1[9] = cVar14 + 'A';
          pcVar1[10] = cVar15 + 'A';
          pcVar1[0xb] = cVar16 + 'A';
          pcVar1[0xc] = cVar17 + 'A';
          pcVar1[0xd] = cVar18 + 'A';
          pcVar1[0xe] = cVar19 + 'A';
          pcVar1[0xf] = cVar20 + 'A';
          lVar3 = lVar3 + 0x10;
          cVar5 = cVar5 + '\x10';
          cVar6 = cVar6 + '\x10';
          cVar7 = cVar7 + '\x10';
          cVar8 = cVar8 + '\x10';
          cVar9 = cVar9 + '\x10';
          cVar10 = cVar10 + '\x10';
          cVar11 = cVar11 + '\x10';
          cVar12 = cVar12 + '\x10';
          cVar13 = cVar13 + '\x10';
          cVar14 = cVar14 + '\x10';
          cVar15 = cVar15 + '\x10';
          cVar16 = cVar16 + '\x10';
          cVar17 = cVar17 + '\x10';
          cVar18 = cVar18 + '\x10';
          cVar19 = cVar19 + '\x10';
          cVar20 = cVar20 + '\x10';
        } while (lVar3 != 0x20);
        return;
      }
      lVar4 = *arg;
      iVar2 = secp256k1_ec_pubkey_serialize(lVar4,&local_98,&local_a0,local_70,0x102);
      if (iVar2 == 0) goto LAB_00103f6e;
      *(undefined8 *)((long)arg + 0x38) = local_87;
      *(undefined8 *)((long)arg + 0x40) = uStack_7f;
      *(undefined8 *)((long)arg + 0x28) = local_97;
      *(undefined8 *)((long)arg + 0x30) = uStack_8f;
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_keygen_run(void *arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char pub33[33];
        size_t len = 33;
        secp256k1_pubkey pubkey;
        CHECK(secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key));
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED));
        memcpy(data->key, pub33 + 1, 32);
    }
}